

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrmapper.c
# Opt level: O0

_Bool addr_mapper_peekaddr(addr_mapper *m,in_addr *nextaddr)

{
  int iVar1;
  _Bool _Var2;
  in_addr_t *in_RSI;
  int *in_RDI;
  in_addr addr;
  
  iVar1 = *in_RDI;
  _Var2 = addr_in_range((in_addr)(iVar1 + 1U),(in_addr)in_RDI[2],(in_addr)in_RDI[1]);
  if (_Var2) {
    *in_RSI = iVar1 + 1U;
  }
  return _Var2;
}

Assistant:

bool addr_mapper_peekaddr(struct addr_mapper * m, struct in_addr * nextaddr)
{
  struct in_addr addr;
  addr.s_addr = m->curaddr.s_addr + 1;
  if (addr_in_range(addr, m->baseaddr, m->netmask))
  {
    nextaddr->s_addr = addr.s_addr;
    return true;
  }
  return false;
}